

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

uint tree_sitter_gdscript_external_scanner_serialize(void *payload,char *buffer)

{
  uint local_34;
  size_t sStack_30;
  int iter;
  size_t delimiter_count;
  size_t size;
  Scanner *scanner;
  char *buffer_local;
  void *payload_local;
  
  sStack_30 = (size_t)**(uint **)((long)payload + 8);
  if (0xff < sStack_30) {
    sStack_30 = 0xff;
  }
  *buffer = (char)sStack_30;
  if (sStack_30 != 0) {
    memcpy(buffer + 1,*(void **)(*(long *)((long)payload + 8) + 8),sStack_30);
  }
  for (local_34 = 1; delimiter_count = sStack_30 + 1,
      local_34 < **payload && delimiter_count < 0x400; local_34 = local_34 + 1) {
    buffer[delimiter_count] =
         (char)*(undefined2 *)(*(long *)(*payload + 8) + (long)(int)local_34 * 2);
    sStack_30 = delimiter_count;
  }
  return (uint)delimiter_count;
}

Assistant:

unsigned tree_sitter_gdscript_external_scanner_serialize(void *payload,
                                                         char *buffer) {
    Scanner *scanner = (Scanner *)payload;

    size_t size = 0;

    size_t delimiter_count = scanner->delimiters->len;
    if (delimiter_count > UINT8_MAX) {
        delimiter_count = UINT8_MAX;
    }
    buffer[size++] = (char)delimiter_count;

    if (delimiter_count > 0) {
        memcpy(&buffer[size], scanner->delimiters->data, delimiter_count);
    }
    size += delimiter_count;

    for (int iter = 1; iter < scanner->indents->len &&
                       size < TREE_SITTER_SERIALIZATION_BUFFER_SIZE;
         ++iter) {
        buffer[size++] = (char)scanner->indents->data[iter];
    }

    return size;
}